

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client-http.c
# Opt level: O0

int lws_http_basic_auth_gen(char *user,char *pw,char *buf,size_t len)

{
  uint in_len;
  size_t sVar1;
  size_t sVar2;
  char local_c8 [8];
  char b [128];
  size_t m;
  size_t n;
  size_t len_local;
  char *buf_local;
  char *pw_local;
  char *user_local;
  
  sVar1 = strlen(user);
  sVar2 = strlen(pw);
  if (len < ((sVar1 + sVar2 + 1) * 4) / 3 + 7) {
    user_local._4_4_ = 1;
  }
  else {
    builtin_strncpy(buf,"Basic ",6);
    in_len = lws_snprintf(local_c8,0x80,"%s:%s",user,pw);
    if (in_len < 0x7e) {
      lws_b64_encode_string(local_c8,in_len,buf + 6,(int)len + -6);
      buf[len - 1] = '\0';
      user_local._4_4_ = 0;
    }
    else {
      user_local._4_4_ = 2;
    }
  }
  return user_local._4_4_;
}

Assistant:

int
lws_http_basic_auth_gen(const char *user, const char *pw, char *buf, size_t len)
{
	size_t n = strlen(user), m = strlen(pw);
	char b[128];

	if (len < 6 + ((4 * (n + m + 1)) / 3) + 1)
		return 1;

	memcpy(buf, "Basic ", 6);

	n = lws_snprintf(b, sizeof(b), "%s:%s", user, pw);
	if (n >= sizeof(b) - 2)
		return 2;

	lws_b64_encode_string(b, (int)n, buf + 6, (int)len - 6);
	buf[len - 1] = '\0';

	return 0;
}